

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_simple.c
# Opt level: O3

int run_test(EVP_MD_CTX *ctx,OSSL_PROVIDER *prov,EVP_MD *md)

{
  int iVar1;
  uchar *md_00;
  long lVar2;
  char msg [14];
  undefined6 uStack_28;
  undefined2 local_22;
  undefined6 uStack_20;
  
  uStack_20 = 0xa21646c726f;
  uStack_28 = 0x2c6f6c6c6548;
  local_22 = 0x5720;
  md_00 = (uchar *)calloc(0x20,1);
  iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)md,(ENGINE *)0x0);
  if (iVar1 == 1) {
    iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,&uStack_28,0xe);
    if (iVar1 == 1) {
      iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)ctx,md_00,(uint *)0x0);
      if (iVar1 == 1) {
        lVar2 = 0;
        while (md_00[lVar2] == (&DAT_00102020)[lVar2]) {
          lVar2 = lVar2 + 1;
          if (lVar2 == 0x20) {
            puts("Success!");
            free(md_00);
            return 0;
          }
        }
        run_test_cold_4();
      }
      else {
        run_test_cold_3();
      }
    }
    else {
      run_test_cold_2();
    }
  }
  else {
    run_test_cold_1();
  }
  return 1;
}

Assistant:

int run_test(EVP_MD_CTX *ctx, OSSL_PROVIDER *prov, EVP_MD *md)
{
	uint8_t *out;

	// "Hello, World!\n"
	const char msg[] = { 0x48, 0x65, 0x6c, 0x6c, 0x6f, 0x2c, 0x20,
			     0x57, 0x6f, 0x72, 0x6c, 0x64, 0x21, 0x0a };
	const uint8_t expected[] = { 0x62, 0x33, 0x83, 0x4b, 0xce, 0x78, 0x17,
				     0xdb, 0x1e, 0x40, 0x1b, 0xce, 0xea, 0x2b,
				     0x8b, 0x45, 0xc1, 0x60, 0x1,  0x15, 0xd2,
				     0x5b, 0x51, 0x90, 0x6c, 0x5,  0xee, 0x32,
				     0x15, 0x6b, 0x51, 0xc2 };

	out = (uint8_t *)calloc(BLAKE3_DIGEST_LENGTH, 1);
	TEST_TRUE(EVP_DigestInit_ex(ctx, md, NULL));
	TEST_TRUE(EVP_DigestUpdate(ctx, msg, sizeof(msg)));
	TEST_TRUE(EVP_DigestFinal_ex(ctx, out, NULL));

	for (int i = 0; i < sizeof(expected); i++) {
		if (out[i] != expected[i]) {
			fprintf(stderr, "Output doesn't match input\n");
			free(out);
			return 1;
		}
	}

	printf("Success!\n");

	free(out);
	return 0;
}